

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall Printer::PrintHeader(Printer *this,ostream *c)

{
  size_t sVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  int iLen;
  int dashes;
  ostream *c_local;
  Printer *this_local;
  
  i = 0;
  for (local_24 = 0; local_24 < this->attrCount; local_24 = local_24 + 1) {
    std::operator<<(c,this->psHeader[local_24]);
    sVar1 = strlen(this->psHeader[local_24]);
    for (local_28 = 0; local_28 < this->spaces[local_24]; local_28 = local_28 + 1) {
      std::operator<<(c," ");
    }
    i = this->spaces[local_24] + (int)sVar1 + i;
  }
  std::operator<<(c,"\n");
  for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
    std::operator<<(c,"-");
  }
  std::operator<<(c,"\n");
  return;
}

Assistant:

void Printer::PrintHeader( ostream &c ) const
{
    int dashes = 0;
    int iLen;
    int i,j;

    for (i = 0; i < attrCount; i++) {
        // Print out the header information name
        c << psHeader[i];
        iLen = strlen(psHeader[i]);
        dashes += iLen;

        for (j = 0; j < spaces[i]; j++)
            c << " ";

        dashes += spaces[i];
    }

    c << "\n";
    for (i = 0; i < dashes; i++) c << "-";
    c << "\n";
}